

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O3

bool P_TryMove(AActor *thing,DVector2 *pos,int dropoff,secplane_t *onfloor,FCheckPosition *tm,
              bool missileCheck)

{
  byte *pbVar1;
  double *pdVar2;
  DVector2 *posforwindowcheck;
  double dVar3;
  int iVar4;
  player_t *ppVar5;
  DBot *pDVar6;
  sector_t *psVar7;
  sector_t *psVar8;
  sector_t_conflict *psVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  spechit_t *psVar16;
  bool bVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  AActor *pAVar21;
  subsector_t *psVar22;
  uint uVar23;
  line_t_conflict *plVar24;
  line_t_conflict *extraout_RDX;
  line_t_conflict *extraout_RDX_00;
  line_t_conflict *extraout_RDX_01;
  line_t_conflict *extraout_RDX_02;
  line_t *plVar25;
  ASectorAction *pAVar26;
  long lVar27;
  ulong uVar28;
  FLinePortal *pFVar29;
  bool bVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar33;
  double dVar34;
  double dVar35;
  FLinkContext ctx;
  FLinkContext ctx_1;
  divline_t local_128;
  undefined1 local_108 [16];
  DVector2 *local_f0;
  sector_t *local_e8;
  FCheckPosition *local_e0;
  Angle *local_d8;
  AActor *local_d0;
  long local_c8;
  long lStack_c0;
  Angle *local_b8;
  double *local_b0;
  DVector3 *local_a8;
  FName local_9c;
  divline_t local_98;
  DVector2 local_78;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  DAngle local_38;
  
  local_e8 = thing->Sector;
  tm->floatok = false;
  tm->portalstep = false;
  dVar34 = (thing->__Pos).Z;
  if (onfloor != (secplane_t *)0x0) {
    (thing->__Pos).Z =
         (pos->Y * (onfloor->normal).Y + onfloor->D + pos->X * (onfloor->normal).X) * onfloor->negiC
    ;
  }
  pbVar1 = (byte *)((long)&(thing->flags6).Value + 3);
  *pbVar1 = *pbVar1 | 0x10;
  local_f0 = pos;
  bVar17 = P_CheckPosition(thing,pos,tm,false);
  if (!bVar17) {
    pAVar21 = thing->BlockingMobj;
    if ((((pAVar21 == (AActor *)0x0) || (pAVar21->player != (player_t *)0x0)) ||
        (thing->player == (player_t *)0x0)) ||
       (dVar35 = (pAVar21->__Pos).Z + pAVar21->Height, dVar33 = dVar35 - (thing->__Pos).Z,
       thing->MaxStepHeight <= dVar33 && dVar33 != thing->MaxStepHeight)) goto LAB_0040da57;
    psVar7 = pAVar21->Sector;
    if ((((local_f0->Y * (psVar7->ceilingplane).normal.Y +
          (psVar7->ceilingplane).D + local_f0->X * (psVar7->ceilingplane).normal.X) *
          (psVar7->ceilingplane).negiC - dVar35 < thing->Height) &&
        ((psVar7->planes[1].Flags & 0x1d0U) != 0x100)) || (tm->ceilingz - dVar35 < thing->Height))
    goto LAB_0040da57;
    if ((((tm->thing->flags2).Value & 0x1000) != 0) && ((i_compatflags & 0x10U) == 0))
    goto LAB_0040d8df;
LAB_0040de8a:
    (thing->__Pos).Z = dVar34;
LAB_0040e97d:
    pbVar1 = (byte *)((long)&(thing->flags6).Value + 3);
    *pbVar1 = *pbVar1 & 0xef;
    return false;
  }
LAB_0040d8df:
  uVar18 = (thing->flags3).Value;
  plVar24 = (line_t_conflict *)(ulong)uVar18;
  if ((uVar18 & 1) == 0) {
    if ((uVar18 & 2) != 0) {
      dVar35 = tm->ceilingz - thing->Height;
      goto LAB_0040d9ff;
    }
  }
  else {
    dVar35 = tm->floorz;
LAB_0040d9ff:
    (thing->__Pos).Z = dVar35;
  }
  if ((onfloor != (secplane_t *)0x0) && (tm->floorsector == thing->floorsector)) {
    (thing->__Pos).Z = tm->floorz;
  }
  uVar20 = (thing->flags).Value;
  if ((uVar20 >> 0xc & 1) == 0) {
    dVar35 = tm->floorz;
    dVar33 = tm->ceilingz;
    dVar3 = thing->Height;
    if (dVar33 - dVar35 < dVar3) {
LAB_0040da57:
      pbVar1 = (byte *)((long)&(thing->flags6).Value + 3);
      *pbVar1 = *pbVar1 & 0xef;
      if (((thing->player == (player_t *)0x0) || ((thing->player->cheats & 0x2000) == 0)) &&
         ((thing->__Pos).Z = dVar34, ((thing->flags).Value & 0x9000) == 0)) {
        pAVar21 = tm->thing;
        if (((pAVar21->flags2).Value & 8) != 0) {
          local_9c.Index = 0x89;
          local_38.Degrees = 0.0;
          P_DamageMobj(pAVar21,(AActor *)0x0,(AActor *)0x0,pAVar21->Mass >> 5,&local_9c,0,&local_38)
          ;
        }
        lVar27 = (long)(int)spechit.Count;
        if (0 < lVar27) {
          uVar28 = lVar27 + 1;
          lVar27 = lVar27 * 0x28 + -0x10;
          do {
            posforwindowcheck = (DVector2 *)((long)&(spechit.Array)->line + lVar27);
            plVar25 = *(line_t **)((long)spechit.Array + lVar27 + -0x18);
            dVar34 = *(double *)((long)&(spechit.Array)->line + lVar27);
            dVar35 = *(double *)((long)&((spechit.Array)->Oldrefpos).X + lVar27);
            if ((i_compatflags2 & 8U) == 0) {
              uVar18 = (uint)(1.52587890625e-05 <
                             (plVar25->delta).Y * ((plVar25->v1->p).X - dVar34) +
                             (plVar25->delta).X * (dVar35 - (plVar25->v1->p).Y));
            }
            else {
              uVar18 = P_VanillaPointOnLineSide(dVar34,dVar35,plVar25);
              plVar25 = (line_t *)posforwindowcheck[-2].Y;
            }
            CheckForPushSpecial(plVar25,uVar18,thing,posforwindowcheck);
            uVar28 = uVar28 - 1;
            lVar27 = lVar27 + -0x28;
          } while (1 < uVar28);
        }
      }
      return false;
    }
    tm->floatok = true;
    if ((((((uVar20 & 0x8000) == 0) && ((uVar18 & 2) == 0)) && (dVar33 < (thing->__Pos).Z + dVar3))
        && (((uVar20 >> 9 & 1) == 0 ||
            (uVar23 = (thing->flags2).Value & 0x10, plVar24 = (line_t_conflict *)(ulong)uVar23,
            uVar23 == 0)))) ||
       (((uVar20 >> 9 & 1) != 0 &&
        ((uVar23 = (thing->flags2).Value & 0x10, plVar24 = (line_t_conflict *)(ulong)uVar23,
         uVar23 != 0 && (dVar33 < dVar3 + (thing->__Pos).Z)))))) goto LAB_0040da57;
    if ((uVar18 & 1) == 0 && (uVar20 & 0x8000) == 0) {
      if ((uVar20 >> 0x10 & 1) == 0) {
        dVar33 = (thing->__Pos).Z;
      }
      else {
        dVar33 = (thing->__Pos).Z;
        if ((((thing->flags6).Value & 0x80) == 0) && (dVar33 < dVar35)) goto LAB_0040da57;
      }
      if (thing->MaxStepHeight <= dVar35 - dVar33 && dVar35 - dVar33 != thing->MaxStepHeight)
      goto LAB_0040da57;
      if (dVar33 < dVar35) {
        (thing->__Pos).Z = dVar35;
        local_108._0_8_ = dVar33;
        bVar17 = P_TestMobjZ(thing,true,(AActor **)0x0);
        (thing->__Pos).Z = (double)local_108._0_8_;
        if (!bVar17) goto LAB_0040da57;
        plVar24 = extraout_RDX;
        if ((((thing->flags6).Value & 0x80) != 0) &&
           ((thing->__Pos).Z = tm->floorz, pdVar2 = &(thing->Vel).Z,
           *pdVar2 <= 0.0 && *pdVar2 != 0.0)) {
          if (((thing->BounceFlags).Value & 2) == 0) {
            (thing->Vel).Z = 0.0;
          }
          else {
            AActor::FloorBounceMissile(thing,&tm->floorsector->floorplane);
            plVar24 = extraout_RDX_02;
          }
        }
      }
    }
    if ((((i_compatflags & 0x100000U) == 0) || (((thing->flags4).Value & 0x80000) != 0)) &&
       (dropoff != 0)) {
      if (dropoff == 2) {
        if ((tm->floorz - tm->dropoffz <= 128.0) &&
           (pAVar21 = (thing->target).field_0.p, pAVar21 != (AActor *)0x0)) {
          if (((pAVar21->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
            if ((pAVar21->__Pos).Z <= tm->dropoffz) goto LAB_0040dd34;
          }
          else {
            (thing->target).field_0.p = (AActor *)0x0;
          }
        }
        goto LAB_0040dd26;
      }
LAB_0040dd34:
      uVar18 = (thing->flags5).Value;
      if ((uVar18 & 4) != 0) goto LAB_0040dd49;
    }
    else {
LAB_0040dd26:
      if (((thing->flags).Value & 0x14400) != 0) goto LAB_0040dd34;
      uVar18 = (thing->flags5).Value;
LAB_0040dd49:
      if ((uVar18 & 0x20) == 0) {
        dVar35 = tm->floorz;
        uVar31 = SUB84(dVar35,0);
        uVar32 = (undefined4)((ulong)dVar35 >> 0x20);
        uVar18 = (thing->flags2).Value;
        if ((uVar18 >> 0xb & 1) != 0) {
          dVar33 = (thing->__Pos).Z;
          if (dVar33 <= dVar35) {
            dVar33 = dVar35;
          }
          uVar31 = SUB84(dVar33,0);
          uVar32 = (undefined4)((ulong)dVar33 >> 0x20);
        }
        dVar35 = (double)CONCAT44(uVar32,uVar31) - tm->dropoffz;
        if ((thing->MaxDropOffHeight <= dVar35 && dVar35 != thing->MaxDropOffHeight) &&
           ((char)((uVar18 & 8) >> 3) == '\0' && !missileCheck)) goto LAB_0040de8a;
      }
      else if ((thing->MaxDropOffHeight < thing->floorz - tm->floorz) ||
              (thing->MaxDropOffHeight < thing->dropoffz - tm->dropoffz)) goto LAB_0040e97d;
    }
    if ((((thing->flags2).Value & 0x2000000) != 0) &&
       ((((tm->floorpic).texnum != (thing->floorpic).texnum ||
         (dVar35 = tm->floorz - (thing->__Pos).Z, dVar35 != 0.0)) || (NAN(dVar35)))))
    goto LAB_0040de8a;
    ppVar5 = thing->player;
    if ((ppVar5 != (player_t *)0x0) && (pDVar6 = (ppVar5->Bot).field_0.p, pDVar6 != (DBot *)0x0)) {
      if (((pDVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        if (((((thing->flags).Value & 4) != 0) && (tm->sector != thing->Sector)) &&
           (bVar17 = FCajunMaster::IsDangerous(&bglobal,tm->sector), plVar24 = extraout_RDX_00,
           bVar17)) {
          pDVar6 = (thing->player->Bot).field_0.p;
          (pDVar6->prev).field_0 = (pDVar6->dest).field_0;
          (((thing->player->Bot).field_0.p)->dest).field_0.p = (AActor *)0x0;
          (thing->Vel).X = 0.0;
          (thing->Vel).Y = 0.0;
          goto LAB_0040de8a;
        }
      }
      else {
        (ppVar5->Bot).field_0.p = (DBot *)0x0;
      }
    }
  }
  if (thing->player == (player_t *)0x0) {
    dVar35 = thing->Height * 0.5;
  }
  else {
    dVar35 = thing->player->viewheight;
  }
  psVar7 = local_e8->heightsec;
  if (psVar7 == (sector_t *)0x0) {
    local_c8 = 1;
    lStack_c0 = 1;
  }
  else {
    dVar33 = (thing->__Pos).X;
    dVar3 = (thing->__Pos).Y;
    local_c8 = -(ulong)(dVar34 + dVar35 <=
                       (psVar7->ceilingplane).negiC *
                       (dVar3 * (psVar7->ceilingplane).normal.Y +
                       (psVar7->ceilingplane).D + dVar33 * (psVar7->ceilingplane).normal.X));
    lStack_c0 = -(ulong)(dVar34 + dVar35 <=
                        (psVar7->floorplane).negiC *
                        (dVar3 * (psVar7->floorplane).normal.Y +
                        (psVar7->floorplane).D + dVar33 * (psVar7->floorplane).normal.X));
  }
  if ((((((thing->BounceFlags).Value & 0x1000) != 0) && (((thing->flags).Value & 0x10200) == 0)) &&
      (bVar17 = AActor::IsSentient(thing), plVar24 = extraout_RDX_01, !bVar17)) &&
     (16.0 < tm->floorz - (thing->__Pos).Z)) goto LAB_0040e97d;
  local_a8 = &thing->Vel;
  local_b0 = &(thing->Vel).Y;
  local_d8 = &(thing->Angles).Yaw;
  bVar17 = false;
  local_e0 = tm;
  local_d0 = thing;
  local_b8 = local_d8;
  do {
    if (portalhit.Count == 0) break;
    lVar27 = 0;
    uVar28 = 0;
    local_108 = ZEXT816(0x3ff199999999999a);
    do {
      psVar16 = portalhit.Array;
      plVar25 = *(line_t **)((long)&(portalhit.Array)->line + lVar27);
      if (plVar25->frontsector->PortalGroup == thing->Sector->PortalGroup) {
        dVar34 = *(double *)((long)&((portalhit.Array)->Oldrefpos).X + lVar27);
        dVar33 = *(double *)((long)&((portalhit.Array)->Oldrefpos).Y + lVar27);
        if ((i_compatflags2 & 8U) == 0) {
          uVar18 = (uint)(1.52587890625e-05 <
                         (plVar25->delta).Y * ((plVar25->v1->p).X - dVar34) +
                         (plVar25->delta).X * (dVar33 - (plVar25->v1->p).Y));
        }
        else {
          uVar18 = P_VanillaPointOnLineSide(dVar34,dVar33,plVar25);
        }
        dVar34 = *(double *)((long)&(psVar16->Refpos).X + lVar27);
        dVar33 = *(double *)((long)&(psVar16->Refpos).Y + lVar27);
        if ((i_compatflags2 & 8U) == 0) {
          bVar30 = 1.52587890625e-05 <
                   (plVar25->delta).Y * ((plVar25->v1->p).X - dVar34) +
                   (plVar25->delta).X * (dVar33 - (plVar25->v1->p).Y);
        }
        else {
          iVar19 = P_VanillaPointOnLineSide(dVar34,dVar33,plVar25);
          bVar30 = iVar19 == 1;
        }
        thing = local_d0;
        if ((uVar18 == 0) && (bVar30)) {
          local_128._0_16_ = plVar25->v1->p;
          local_128.dx = (plVar25->delta).X;
          local_128.dy = (plVar25->delta).Y;
          pdVar2 = (double *)((long)&(psVar16->Oldrefpos).X + lVar27);
          local_98.x = *pdVar2;
          local_98.y = pdVar2[1];
          pdVar2 = (double *)((long)&(psVar16->Refpos).X + lVar27);
          local_98.dx = *pdVar2 - local_98.x;
          local_98.dy = pdVar2[1] - local_98.y;
          dVar34 = P_InterceptVector(&local_98,&local_128);
          if (dVar34 < (double)local_108._0_8_) {
            plVar24 = *(line_t_conflict **)((long)&psVar16->line + lVar27);
            pdVar2 = (double *)((long)&(psVar16->Oldrefpos).X + lVar27);
            local_48 = *pdVar2;
            dStack_40 = pdVar2[1];
            pdVar2 = (double *)((long)&(psVar16->Refpos).X + lVar27);
            local_58 = *pdVar2;
            dStack_50 = pdVar2[1];
            local_d8 = (Angle *)(uVar28 & 0xffffffff);
            local_108._8_4_ = extraout_XMM0_Dc;
            local_108._0_8_ = dVar34;
            local_108._12_4_ = extraout_XMM0_Dd;
          }
        }
      }
      tm = local_e0;
      uVar28 = uVar28 + 1;
      lVar27 = lVar27 + 0x28;
    } while (uVar28 < portalhit.Count);
    if (1.1 <= (double)local_108._0_8_) break;
    uVar18 = (uint)local_d8;
    if (uVar18 < portalhit.Count) {
      portalhit.Count = portalhit.Count - 1;
      if (uVar18 <= portalhit.Count && portalhit.Count - uVar18 != 0) {
        memmove(portalhit.Array + ((ulong)local_d8 & 0xffffffff),portalhit.Array + (uVar18 + 1),
                (ulong)(portalhit.Count - uVar18) * 0x28);
      }
    }
    pFVar29 = linePortals.Array + plVar24->portalindex;
    if (linePortals.Count <= plVar24->portalindex) {
      pFVar29 = (FLinePortal *)0x0;
    }
    if (pFVar29->mType == '\x03') {
      local_128._0_16_ = ZEXT816(0);
      AActor::UnlinkFromWorld(thing,(FLinkContext *)&local_128);
      dVar33 = (pFVar29->mDisplacement).X;
      dVar13 = (pFVar29->mDisplacement).Y;
      dVar34 = (tm->pos).X + dVar33;
      dVar3 = (tm->pos).Y + dVar13;
      auVar10._8_4_ = SUB84(dVar3,0);
      auVar10._0_8_ = dVar34;
      auVar10._12_4_ = (int)((ulong)dVar3 >> 0x20);
      (thing->__Pos).X = dVar34;
      (thing->__Pos).Y = (double)auVar10._8_8_;
      dVar33 = (thing->Prev).X + dVar33;
      dVar13 = (thing->Prev).Y + dVar13;
      auVar11._8_4_ = SUB84(dVar13,0);
      auVar11._0_8_ = dVar33;
      auVar11._12_4_ = (int)((ulong)dVar13 >> 0x20);
      (thing->Prev).X = dVar33;
      (thing->Prev).Y = (double)auVar11._8_8_;
      AActor::LinkToWorld(thing,(FLinkContext *)&local_128,false,(sector_t *)0x0);
      P_FindFloorCeiling(thing,0);
      tm->portalstep = false;
      bVar17 = true;
    }
    else if (!bVar17) {
      dVar34 = (thing->__Pos).Z;
      local_128.x = (tm->pos).X;
      local_128.y = (tm->pos).Y;
      local_98.x = (thing->__Pos).X;
      local_98.y = (thing->__Pos).Y;
      local_128.dx = dVar34;
      local_68 = local_98.x;
      dStack_60 = local_98.y;
      P_TranslatePortalXY(plVar24,(double *)&local_128,(double *)((long)&local_128 + 8));
      P_TranslatePortalXY(plVar24,&local_98.x,&local_98.y);
      P_TranslatePortalZ(plVar24,(double *)((long)&local_128 + 0x10U));
      (thing->__Pos).Z = local_128.dx;
      (thing->__Pos).X = local_98.x;
      (thing->__Pos).Y = local_98.y;
      local_78.X = local_128.x;
      local_78.Y = local_128.y;
      bVar17 = P_CheckPosition(thing,&local_78,true);
      if (!bVar17) {
        (thing->__Pos).Z = dVar34;
        (thing->__Pos).X = local_68;
        (thing->__Pos).Y = dStack_60;
        goto LAB_0040e97d;
      }
      local_78.X = 0.0;
      local_78.Y = 0.0;
      AActor::UnlinkFromWorld(thing,(FLinkContext *)&local_78);
      (thing->__Pos).Z = local_128.dx;
      (thing->__Pos).X = local_128.x;
      (thing->__Pos).Y = local_128.y;
      P_TranslatePortalVXVY(plVar24,&local_a8->X,local_b0);
      P_TranslatePortalAngle(plVar24,local_b8);
      iVar19 = 0;
      AActor::LinkToWorld(thing,(FLinkContext *)&local_78,false,(sector_t *)0x0);
      P_FindFloorCeiling(thing,0);
      (thing->Prev).Z = (thing->__Pos).Z;
      dVar34 = (thing->__Pos).Y;
      (thing->Prev).X = (thing->__Pos).X;
      (thing->Prev).Y = dVar34;
      (thing->PrevAngles).Roll.Degrees = (thing->Angles).Roll.Degrees;
      dVar34 = (thing->Angles).Yaw.Degrees;
      (thing->PrevAngles).Pitch.Degrees = (thing->Angles).Pitch.Degrees;
      (thing->PrevAngles).Yaw.Degrees = dVar34;
      if (thing->Sector != (sector_t *)0x0) {
        iVar19 = thing->Sector->PortalGroup;
      }
      thing->PrevPortalGroup = iVar19;
      tm->portalstep = false;
      bVar17 = true;
    }
    pAVar21 = (AActor *)(&DAT_017e1fb8)[(long)consoleplayer * 0x54];
    if (pAVar21 == (AActor *)0x0) {
LAB_0040e4bc:
      pAVar21 = (AActor *)0x0;
    }
    else if (((pAVar21->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (&DAT_017e1fb8)[(long)consoleplayer * 0x54] = 0;
      goto LAB_0040e4bc;
    }
    if (pAVar21 == thing) {
      local_128.y = (double)local_108._0_8_ * (dStack_50 - dStack_40) + dStack_40;
      local_128.x = (double)local_108._0_8_ * (local_58 - local_48) + local_48;
      local_128.dx = 0.0;
      local_128.dy = 0.0;
      R_AddInterpolationPoint((DVector3a *)&local_128);
      if (pFVar29->mType == '\x03') {
        dVar34 = (pFVar29->mDisplacement).Y + local_128.y;
        local_128.y._0_4_ = SUB84(dVar34,0);
        local_128.x = (pFVar29->mDisplacement).X + local_128.x;
        local_128.y._4_4_ = (int)((ulong)dVar34 >> 0x20);
      }
      else {
        P_TranslatePortalXY(plVar24,(double *)&local_128,(double *)((long)&local_128 + 8));
        P_TranslatePortalZ(plVar24,(double *)((long)&local_128 + 0x10U));
        *(double *)(&DAT_017e1ea0 + (long)consoleplayer * 0x2a0) =
             local_128.dx + *(double *)(&DAT_017e1ea0 + (long)consoleplayer * 0x2a0);
        P_TranslatePortalAngle(plVar24,(DAngle *)&local_128.dy);
      }
      R_AddInterpolationPoint((DVector3a *)&local_128);
    }
  } while (pFVar29->mType == '\x03');
  if (!bVar17) {
    local_128._0_16_ = ZEXT816(0);
    AActor::UnlinkFromWorld(thing,(FLinkContext *)&local_128);
    dVar34 = tm->ceilingz;
    thing->floorz = tm->floorz;
    thing->ceilingz = dVar34;
    thing->dropoffz = tm->dropoffz;
    (thing->floorpic).texnum = (tm->floorpic).texnum;
    thing->floorterrain = tm->floorterrain;
    thing->floorsector = tm->floorsector;
    (thing->ceilingpic).texnum = (tm->ceilingpic).texnum;
    thing->ceilingsector = tm->ceilingsector;
    dVar34 = local_f0->Y;
    (thing->__Pos).X = local_f0->X;
    (thing->__Pos).Y = dVar34;
    AActor::LinkToWorld(thing,(FLinkContext *)&local_128,false,(sector_t *)0x0);
  }
  if (((thing->flags2).Value & 0x20) != 0) {
    AActor::AdjustFloorClip(thing);
  }
  if (spechit.Count != 0 && ((thing->flags).Value & 0x9000) == 0) {
    do {
      spechit.Count = spechit.Count - 1;
      plVar24 = (line_t_conflict *)spechit.Array[spechit.Count].line;
      dVar34 = spechit.Array[spechit.Count].Oldrefpos.Y;
      dVar33 = spechit.Array[spechit.Count].Oldrefpos.X;
      dVar3 = spechit.Array[spechit.Count].Refpos.Y;
      dVar13 = spechit.Array[spechit.Count].Refpos.X;
      if ((i_compatflags2 & 8U) == 0) {
        uVar18 = (uint)(1.52587890625e-05 <
                       (plVar24->delta).Y * ((plVar24->v1->p).X - dVar13) +
                       (plVar24->delta).X * (dVar3 - (plVar24->v1->p).Y));
      }
      else {
        local_108._8_8_ = 0;
        local_108._0_8_ = dVar33;
        uVar18 = P_VanillaPointOnLineSide(dVar13,dVar3,(line_t *)plVar24);
        dVar33 = (double)local_108._0_8_;
      }
      if ((i_compatflags2 & 8U) == 0) {
        uVar20 = (uint)(1.52587890625e-05 <
                       (plVar24->delta).Y * ((plVar24->v1->p).X - dVar33) +
                       (plVar24->delta).X * (dVar34 - (plVar24->v1->p).Y));
      }
      else {
        uVar20 = P_VanillaPointOnLineSide(dVar33,dVar34,(line_t *)plVar24);
      }
      if (((uVar18 != uVar20) && (iVar19 = plVar24->special, iVar19 != 0)) &&
         (((thing->flags6).Value & 0x10000) == 0)) {
        if (thing->player == (player_t *)0x0) {
          uVar18 = (thing->flags2).Value;
          if ((uVar18 >> 0x17 & 1) == 0) {
            if ((uVar18 >> 0x18 & 1) == 0) {
              if ((iVar19 - 0x46U < 2) || (iVar19 == 0xd7)) goto LAB_0040e8fd;
              iVar19 = 0x80;
            }
            else {
              iVar19 = 0x20;
            }
          }
          else {
LAB_0040e8fd:
            iVar19 = 4;
          }
LAB_0040e92d:
          P_ActivateLine(plVar24,thing,uVar20,iVar19,(DVector3 *)0x0);
        }
        else {
          if ((thing->player->cheats & 0x2000) == 0) {
            iVar19 = 1;
            goto LAB_0040e92d;
          }
          P_PredictLine(plVar24,thing,uVar20,1);
        }
      }
    } while (spechit.Count != 0);
  }
  if ((thing->player != (player_t *)0x0) && ((thing->player->cheats & 0x2000) != 0))
  goto LAB_0040eab3;
  psVar7 = thing->Sector;
  psVar8 = psVar7->heightsec;
  if ((psVar8 != (sector_t *)0x0) &&
     ((local_e8->heightsec != (sector_t *)0x0 &&
      (pAVar26 = (psVar7->SecActTarget).field_0.p, pAVar26 != (ASectorAction *)0x0)))) {
    if (((pAVar26->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
      dVar35 = dVar35 + (thing->__Pos).Z;
      dVar34 = (local_f0->Y * (psVar8->floorplane).normal.Y +
               (psVar8->floorplane).D + local_f0->X * (psVar8->floorplane).normal.X) *
               (psVar8->floorplane).negiC;
      auVar14._8_8_ = lStack_c0;
      auVar14._0_8_ = local_c8;
      if ((((auVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
          (iVar19 = 0x80, dVar34 < dVar35)) ||
         (iVar19 = 0x40,
         (auVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0 && dVar35 <= dVar34)) {
        ASectorAction::TriggerAction(pAVar26,thing,iVar19);
      }
      if ((psVar8->MoreFlags & 2) == 0) {
        dVar34 = (local_f0->Y * (psVar8->ceilingplane).normal.Y +
                 (psVar8->ceilingplane).D + local_f0->X * (psVar8->ceilingplane).normal.X) *
                 (psVar8->ceilingplane).negiC;
        auVar15._8_8_ = lStack_c0;
        auVar15._0_8_ = local_c8;
        if (((auVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0) || (dVar35 <= dVar34)) {
          if ((auVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0 || dVar34 < dVar35)
          goto LAB_0040e9ae;
          pAVar26 = (psVar7->SecActTarget).field_0.p;
          iVar19 = 0x100;
        }
        else {
          pAVar26 = (psVar7->SecActTarget).field_0.p;
          iVar19 = 0x200;
        }
        ASectorAction::TriggerAction(pAVar26,thing,iVar19);
      }
    }
    else {
      (psVar7->SecActTarget).field_0.p = (ASectorAction *)0x0;
    }
  }
LAB_0040e9ae:
  if (tm->portalstep == true) {
    local_128._0_16_ = ZEXT816(0);
    dVar33 = (thing->__Pos).X;
    dVar3 = (thing->__Pos).Y;
    local_108._0_8_ = (thing->__Pos).Z;
    AActor::UnlinkFromWorld(thing,(FLinkContext *)&local_128);
    dVar34 = 0.0;
    dVar35 = 0.0;
    iVar19 = thing->Sector->PortalGroup;
    iVar4 = (sectorPortals.Array[thing->Sector->Portals[1]].mDestination)->PortalGroup;
    if (iVar19 != iVar4) {
      dVar34 = Displacements.data.Array[iVar4 * Displacements.size + iVar19].pos.X;
      dVar35 = Displacements.data.Array[iVar4 * Displacements.size + iVar19].pos.Y;
    }
    dVar34 = (thing->__Pos).X + dVar34;
    dVar35 = (thing->__Pos).Y + dVar35;
    auVar12._8_4_ = SUB84(dVar35,0);
    auVar12._0_8_ = dVar34;
    auVar12._12_4_ = (int)((ulong)dVar35 >> 0x20);
    (thing->__Pos).X = dVar34;
    (thing->__Pos).Y = (double)auVar12._8_8_;
    (thing->Prev).Z = (thing->__Pos).Z - (double)local_108._0_8_;
    (thing->Prev).X = dVar34 - dVar33;
    (thing->Prev).Y = dVar35 - dVar3;
    psVar22 = P_PointInSubsector(dVar34,dVar35);
    psVar9 = psVar22->sector;
    thing->Sector = (sector_t *)psVar9;
    thing->PrevPortalGroup = psVar9->PortalGroup;
    AActor::LinkToWorld(thing,(FLinkContext *)&local_128,false,(sector_t *)0x0);
    P_FindFloorCeiling(thing,0);
  }
  AActor::CheckSectorTransition(thing,local_e8);
LAB_0040eab3:
  pbVar1 = (byte *)((long)&(thing->flags6).Value + 3);
  *pbVar1 = *pbVar1 & 0xef;
  return true;
}

Assistant:

bool P_TryMove(AActor *thing, const DVector2 &pos,
	int dropoff, // killough 3/15/98: allow dropoff as option
	const secplane_t *onfloor, // [RH] Let P_TryMove keep the thing on the floor
	FCheckPosition &tm,
	bool missileCheck)	// [GZ] Fired missiles ignore the drop-off test
{
	sector_t	*oldsector;
	double		oldz;
	int 		side;
	int 		oldside;
	sector_t*	oldsec = thing->Sector;	// [RH] for sector actions
	sector_t*	newsec;

	tm.floatok = false;
	tm.portalstep = false;
	oldz = thing->Z();
	if (onfloor)
	{
		thing->SetZ(onfloor->ZatPoint(pos));
	}
	thing->flags6 |= MF6_INTRYMOVE;
	if (!P_CheckPosition(thing, pos, tm))
	{
		AActor *BlockingMobj = thing->BlockingMobj;
		// Solid wall or thing
		if (!BlockingMobj || BlockingMobj->player || !thing->player)
		{
			goto pushline;
		}
		else
		{
			if (BlockingMobj->player || !thing->player)
			{
				goto pushline;
			}
			else if (BlockingMobj->Top() - thing->Z() > thing->MaxStepHeight
				|| ((BlockingMobj->Sector->ceilingplane.ZatPoint(pos) - (BlockingMobj->Top()) < thing->Height) && BlockingMobj->Sector->PortalBlocksMovement(sector_t::ceiling))
				|| (tm.ceilingz - (BlockingMobj->Top()) < thing->Height))
			{
				goto pushline;
			}
		}
		if (!(tm.thing->flags2 & MF2_PASSMOBJ) || (i_compatflags & COMPATF_NO_PASSMOBJ))
		{
			thing->SetZ(oldz);
			thing->flags6 &= ~MF6_INTRYMOVE;
			return false;
		}
	}

	if (thing->flags3 & MF3_FLOORHUGGER)
	{
		thing->SetZ(tm.floorz);
	}
	else if (thing->flags3 & MF3_CEILINGHUGGER)
	{
		thing->SetZ(tm.ceilingz - thing->Height);
	}

	if (onfloor && tm.floorsector == thing->floorsector)
	{
		thing->SetZ(tm.floorz);
	}
	if (!(thing->flags & MF_NOCLIP))
	{
		if (tm.ceilingz - tm.floorz < thing->Height)
		{
			goto pushline;		// doesn't fit
		}

		tm.floatok = true;

		if (!(thing->flags & MF_TELEPORT)
			&& tm.ceilingz < thing->Top()
			&& !(thing->flags3 & MF3_CEILINGHUGGER)
			&& (!(thing->flags2 & MF2_FLY) || !(thing->flags & MF_NOGRAVITY)))
		{
			goto pushline;		// mobj must lower itself to fit
		}
		if (thing->flags2 & MF2_FLY && thing->flags & MF_NOGRAVITY)
		{
#if 1
			if (thing->Top() > tm.ceilingz)
				goto pushline;
#else
			// When flying, slide up or down blocking lines until the actor
			// is not blocked.
			if (thing->Top() > tm.ceilingz)
			{
				thing->Vel.Z = -8;
				goto pushline;
			}
			else if (thing->Z() < tm.floorz && tm.floorz - tm.dropoffz > thing->MaxDropOffHeight)
			{
				thing->Vel.Z = 8;
				goto pushline;
			}
#endif
		}
		if (!(thing->flags & MF_TELEPORT) && !(thing->flags3 & MF3_FLOORHUGGER))
		{
			if ((thing->flags & MF_MISSILE) && !(thing->flags6 & MF6_STEPMISSILE) && tm.floorz > thing->Z())
			{ // [RH] Don't let normal missiles climb steps
				goto pushline;
			}
			if (tm.floorz - thing->Z() > thing->MaxStepHeight)
			{ // too big a step up
				goto pushline;
			}
			else if (thing->Z() < tm.floorz)
			{ // [RH] Check to make sure there's nothing in the way for the step up
				double savedz = thing->Z();
				bool good;
				thing->SetZ(tm.floorz);
				good = P_TestMobjZ(thing);
				thing->SetZ(savedz);
				if (!good)
				{
					goto pushline;
				}
				if (thing->flags6 & MF6_STEPMISSILE)
				{
					thing->SetZ(tm.floorz);
					// If moving down, cancel vertical component of the velocity
					if (thing->Vel.Z < 0)
					{
						// If it's a bouncer, let it bounce off its new floor, too.
						if (thing->BounceFlags & BOUNCE_Floors)
						{
							thing->FloorBounceMissile(tm.floorsector->floorplane);
						}
						else
						{
							thing->Vel.Z = 0;
						}
					}
				}
			}
		}

		// compatibility check: Doom originally did not allow monsters to cross dropoffs at all.
		// If the compatibility flag is on, only allow this when the velocity comes from a scroller
		if ((i_compatflags & COMPATF_CROSSDROPOFF) && !(thing->flags4 & MF4_SCROLLMOVE))
		{
			dropoff = false;
		}

		if (dropoff == 2 &&  // large jump down (e.g. dogs)
			(tm.floorz - tm.dropoffz > 128. || thing->target == NULL || thing->target->Z() >tm.dropoffz))
		{
			dropoff = false;
		}


		// killough 3/15/98: Allow certain objects to drop off
		if ((!dropoff && !(thing->flags & (MF_DROPOFF | MF_FLOAT | MF_MISSILE))) || (thing->flags5&MF5_NODROPOFF))
		{
			if (!(thing->flags5&MF5_AVOIDINGDROPOFF))
			{
				double floorz = tm.floorz;
				// [RH] If the thing is standing on something, use its current z as the floorz.
				// This is so that it does not walk off of things onto a drop off.
				if (thing->flags2 & MF2_ONMOBJ)
				{
					floorz = MAX(thing->Z(), tm.floorz);
				}

				if (floorz - tm.dropoffz > thing->MaxDropOffHeight &&
					!(thing->flags2 & MF2_BLASTED) && !missileCheck)
				{ // Can't move over a dropoff unless it's been blasted
					// [GZ] Or missile-spawned
					thing->SetZ(oldz);
					thing->flags6 &= ~MF6_INTRYMOVE;
					return false;
				}
			}
			else
			{
				// special logic to move a monster off a dropoff
				// this intentionally does not check for standing on things.
				if (thing->floorz - tm.floorz > thing->MaxDropOffHeight ||
					thing->dropoffz - tm.dropoffz > thing->MaxDropOffHeight)
				{
					thing->flags6 &= ~MF6_INTRYMOVE;
					return false;
				}
			}
		}
		if (thing->flags2 & MF2_CANTLEAVEFLOORPIC
			&& (tm.floorpic != thing->floorpic
			|| tm.floorz - thing->Z() != 0))
		{ // must stay within a sector of a certain floor type
			thing->SetZ(oldz);
			thing->flags6 &= ~MF6_INTRYMOVE;
			return false;
		}

		//Added by MC: To prevent bot from getting into dangerous sectors.
		if (thing->player && thing->player->Bot != NULL && thing->flags & MF_SHOOTABLE)
		{
			if (tm.sector != thing->Sector
				&& bglobal.IsDangerous(tm.sector))
			{
				thing->player->Bot->prev = thing->player->Bot->dest;
				thing->player->Bot->dest = NULL;
				thing->Vel.X = thing->Vel.Y = 0;
				thing->SetZ(oldz);
				thing->flags6 &= ~MF6_INTRYMOVE;
				return false;
			}
		}
	}

	// [RH] Check status of eyes against fake floor/ceiling in case
	// it slopes or the player's eyes are bobbing in and out.

	bool oldAboveFakeFloor, oldAboveFakeCeiling;
	double viewheight;
	// pacify GCC
	viewheight = thing->player ? thing->player->viewheight : thing->Height / 2;
	oldAboveFakeFloor = oldAboveFakeCeiling = false;

	if (oldsec->heightsec)
	{
		double eyez = oldz + viewheight;

		oldAboveFakeFloor = eyez > oldsec->heightsec->floorplane.ZatPoint(thing);
		oldAboveFakeCeiling = eyez > oldsec->heightsec->ceilingplane.ZatPoint(thing);
	}

	// Borrowed from MBF: 
	if (thing->BounceFlags & BOUNCE_MBF &&  // killough 8/13/98
		!(thing->flags & (MF_MISSILE | MF_NOGRAVITY)) &&
		!thing->IsSentient() && tm.floorz - thing->Z() > 16)
	{ // too big a step up for MBF bouncers under gravity
		thing->flags6 &= ~MF6_INTRYMOVE;
		return false;
	}


	// Check for crossed portals
	bool portalcrossed;
	portalcrossed = false;

	while (true)
	{
		double bestfrac = 1.1;
		spechit_t besthit;
		int besthitnum;
		// find the portal nearest to the crossing actor
		for (unsigned i = 0; i < portalhit.Size();i++)
		{
			auto &spec = portalhit[i];

			line_t *ld = spec.line;
			if (ld->frontsector->PortalGroup != thing->Sector->PortalGroup) continue;	// must be in the same group to be considered valid.

			// see if the line was crossed
			oldside = P_PointOnLineSide(spec.Oldrefpos, ld);
			side = P_PointOnLineSide(spec.Refpos, ld);
			if (oldside == 0 && side == 1)
			{
				divline_t dl2 = { ld->v1->fX(), ld->v1->fY(), ld->Delta().X, ld->Delta().Y };
				divline_t dl1 = { spec.Oldrefpos.X, spec.Oldrefpos.Y, spec.Refpos.X - spec.Oldrefpos.X, spec.Refpos.Y - spec.Oldrefpos.Y };
				double frac = P_InterceptVector(&dl1, &dl2);
				if (frac < bestfrac)
				{
					besthit = spec;
					bestfrac = frac;
					besthitnum = i;
				}
			}
		}

		if (bestfrac < 1.1)
		{
			portalhit.Delete(besthitnum);
			line_t *ld = besthit.line;
			FLinePortal *port = ld->getPortal();
			if (port->mType == PORTT_LINKED)
			{
				FLinkContext ctx;
				thing->UnlinkFromWorld(&ctx);
				thing->SetXY(tm.pos + port->mDisplacement);
				thing->Prev += port->mDisplacement;
				thing->LinkToWorld(&ctx);
				P_FindFloorCeiling(thing);
				portalcrossed = true;
				tm.portalstep = false;
			}
			else if (!portalcrossed)
			{
				DVector3 pos(tm.pos, thing->Z());
				DVector3 oldthingpos = thing->Pos();
				DVector2 thingpos = oldthingpos;
				
				P_TranslatePortalXY(ld, pos.X, pos.Y);
				P_TranslatePortalXY(ld, thingpos.X, thingpos.Y);
				P_TranslatePortalZ(ld, pos.Z);
				thing->SetXYZ(thingpos.X, thingpos.Y, pos.Z);
				if (!P_CheckPosition(thing, pos, true))	// check if some actor blocks us on the other side. (No line checks, because of the mess that'd create.)
				{
					thing->SetXYZ(oldthingpos);
					thing->flags6 &= ~MF6_INTRYMOVE;
					return false;
				}
				FLinkContext ctx;
				thing->UnlinkFromWorld(&ctx);
				thing->SetXYZ(pos);
				P_TranslatePortalVXVY(ld, thing->Vel.X, thing->Vel.Y);
				P_TranslatePortalAngle(ld, thing->Angles.Yaw);
				thing->LinkToWorld(&ctx);
				P_FindFloorCeiling(thing);
				thing->ClearInterpolation();
				portalcrossed = true;
				tm.portalstep = false;
			}
			// if this is the current camera we need to store the point where the portal was crossed and the exit
			// so that the renderer can properly calculate an interpolated position along the movement path.
			if (thing == players[consoleplayer].camera)
			{
				divline_t dl1 = { besthit.Oldrefpos.X,besthit.Oldrefpos.Y, besthit.Refpos.X - besthit.Oldrefpos.X, besthit.Refpos.Y - besthit.Oldrefpos.Y };
				DVector3a hit = { {dl1.x + dl1.dx * bestfrac, dl1.y + dl1.dy * bestfrac, 0.},0. };

				R_AddInterpolationPoint(hit);
				if (port->mType == PORTT_LINKED)
				{
					hit.pos.X += port->mDisplacement.X;
					hit.pos.Y += port->mDisplacement.Y;
				}
				else
				{
					P_TranslatePortalXY(ld, hit.pos.X, hit.pos.Y);
					P_TranslatePortalZ(ld, hit.pos.Z);
					players[consoleplayer].viewz += hit.pos.Z;	// needs to be done here because otherwise the renderer will not catch the change.
					P_TranslatePortalAngle(ld, hit.angle);
				}
				R_AddInterpolationPoint(hit);
			}
			if (port->mType == PORTT_LINKED)
			{
				continue;
		}
		}
		break;
	}



	if (!portalcrossed)
	{
		// the move is ok, so link the thing into its new position
		FLinkContext ctx;
		thing->UnlinkFromWorld(&ctx);

		oldsector = thing->Sector;
		thing->floorz = tm.floorz;
		thing->ceilingz= tm.ceilingz;
		thing->dropoffz = tm.dropoffz;		// killough 11/98: keep track of dropoffs
		thing->floorpic = tm.floorpic;
		thing->floorterrain = tm.floorterrain;
		thing->floorsector = tm.floorsector;
		thing->ceilingpic = tm.ceilingpic;
		thing->ceilingsector = tm.ceilingsector;
		thing->SetXY(pos);

		thing->LinkToWorld(&ctx);
	}

	if (thing->flags2 & MF2_FLOORCLIP)
	{
		thing->AdjustFloorClip();
	}

	// if any special lines were hit, do the effect
	if (!(thing->flags & (MF_TELEPORT | MF_NOCLIP)))
	{
		spechit_t spec;
		DVector2 lastpos = thing->Pos();
		while (spechit.Pop(spec))
		{
			line_t *ld = spec.line;
			// see if the line was crossed

			side = P_PointOnLineSide(spec.Refpos, ld);
			oldside = P_PointOnLineSide(spec.Oldrefpos, ld);
			if (side != oldside && ld->special && !(thing->flags6 & MF6_NOTRIGGER))
			{
				if (thing->player && (thing->player->cheats & CF_PREDICTING))
				{
					P_PredictLine(ld, thing, oldside, SPAC_Cross);
				}
				else if (thing->player)
				{
					P_ActivateLine(ld, thing, oldside, SPAC_Cross);
				}
				else if (thing->flags2 & MF2_MCROSS)
				{
					P_ActivateLine(ld, thing, oldside, SPAC_MCross);
				}
				else if (thing->flags2 & MF2_PCROSS)
				{
					P_ActivateLine(ld, thing, oldside, SPAC_PCross);
				}
				else if ((ld->special == Teleport ||
					ld->special == Teleport_NoFog ||
					ld->special == Teleport_Line))
				{	// [RH] Just a little hack for BOOM compatibility
					P_ActivateLine(ld, thing, oldside, SPAC_MCross);
				}
				else
				{
					P_ActivateLine(ld, thing, oldside, SPAC_AnyCross);
				}
			}
		}
	}

	// [RH] Don't activate anything if just predicting
	if (thing->player && (thing->player->cheats & CF_PREDICTING))
	{
		thing->flags6 &= ~MF6_INTRYMOVE;
		return true;
	}

	// [RH] Check for crossing fake floor/ceiling
	newsec = thing->Sector;
	if (newsec->heightsec && oldsec->heightsec && newsec->SecActTarget)
	{
		const sector_t *hs = newsec->heightsec;
		double eyez = thing->Z() + viewheight;
		double fakez = hs->floorplane.ZatPoint(pos);

		if (!oldAboveFakeFloor && eyez > fakez)
		{ // View went above fake floor
			newsec->SecActTarget->TriggerAction(thing, SECSPAC_EyesSurface);
		}
		else if (oldAboveFakeFloor && eyez <= fakez)
		{ // View went below fake floor
			newsec->SecActTarget->TriggerAction(thing, SECSPAC_EyesDive);
		}

		if (!(hs->MoreFlags & SECF_FAKEFLOORONLY))
		{
			fakez = hs->ceilingplane.ZatPoint(pos);
			if (!oldAboveFakeCeiling && eyez > fakez)
			{ // View went above fake ceiling
				newsec->SecActTarget->TriggerAction(thing, SECSPAC_EyesAboveC);
			}
			else if (oldAboveFakeCeiling && eyez <= fakez)
			{ // View went below fake ceiling
				newsec->SecActTarget->TriggerAction(thing, SECSPAC_EyesBelowC);
			}
		}
	}

	// If the actor stepped through a ceiling portal we need to reacquire the actual position info after the transition
	if (tm.portalstep)
	{
		FLinkContext ctx;
		DVector3 oldpos = thing->Pos();
		thing->UnlinkFromWorld(&ctx);
		thing->SetXYZ(thing->PosRelative(thing->Sector->GetOppositePortalGroup(sector_t::ceiling)));
		thing->Prev = thing->Pos() - oldpos;
		thing->Sector = P_PointInSector(thing->Pos());
		thing->PrevPortalGroup = thing->Sector->PortalGroup;
		thing->LinkToWorld(&ctx);

		P_FindFloorCeiling(thing);
	}

	// [RH] If changing sectors, trigger transitions
	thing->CheckSectorTransition(oldsec);
	thing->flags6 &= ~MF6_INTRYMOVE;
	return true;

pushline:
	thing->flags6 &= ~MF6_INTRYMOVE;

	// [RH] Don't activate anything if just predicting
	if (thing->player && (thing->player->cheats & CF_PREDICTING))
	{
		return false;
	}

	thing->SetZ(oldz);
	if (!(thing->flags&(MF_TELEPORT | MF_NOCLIP)))
	{
		int numSpecHitTemp;

		if (tm.thing->flags2 & MF2_BLASTED)
		{
			P_DamageMobj(tm.thing, NULL, NULL, tm.thing->Mass >> 5, NAME_Melee);
		}
		numSpecHitTemp = (int)spechit.Size();
		while (numSpecHitTemp > 0)
		{
			// see which lines were pushed
			spechit_t &spec = spechit[--numSpecHitTemp];
			side = P_PointOnLineSide(spec.Refpos, spec.line);
			CheckForPushSpecial(spec.line, side, thing, &spec.Refpos);
		}
	}
	return false;
}